

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall inja::StatisticsVisitor::visit(StatisticsVisitor *this,IfStatementNode *node)

{
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int __fd;
  IfStatementNode *node_local;
  StatisticsVisitor *this_local;
  
  __fd = (int)this;
  ExpressionListNode::accept(&node->condition,__fd,in_RDX,in_RCX);
  BlockNode::accept(&node->true_statement,__fd,__addr,in_RCX);
  BlockNode::accept(&node->false_statement,__fd,__addr_00,in_RCX);
  return;
}

Assistant:

void visit(const IfStatementNode& node) {
    node.condition.accept(*this);
    node.true_statement.accept(*this);
    node.false_statement.accept(*this);
  }